

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

uint __thiscall
Js::ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)2>(Data *this,OpCode op,ByteCodeWriter *writer)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (writer->useBranchIsland == true) {
    EnsureLongBranch(writer,op);
  }
  if (Decr_Num_A < op) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xd51,"(op < Js::OpCode::ByteCodeLast)",
                                "op < Js::OpCode::ByteCodeLast");
    if (!bVar3) goto LAB_008ab8ed;
    *puVar4 = 0;
  }
  bVar3 = OpCodeAttr::BackEndOnly(op);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xd52,"(!OpCodeAttr::BackEndOnly(op))",
                                "!OpCodeAttr::BackEndOnly(op)");
    if (!bVar3) goto LAB_008ab8ed;
    *puVar4 = 0;
  }
  bVar3 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xd53,
                                "(layoutSize == SmallLayout || OpCodeAttr::HasMultiSizeLayout(op))",
                                "layoutSize == SmallLayout || OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar3) {
LAB_008ab8ed:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  uVar1 = this->currentOffset;
  EncodeOpCode<(Js::LayoutSize)2>(this,op,writer);
  if (op != Ld_A) {
    writer->m_byteCodeWithoutLDACount = writer->m_byteCodeWithoutLDACount + 1;
  }
  writer->m_byteCodeCount = writer->m_byteCodeCount + 1;
  if (0 < writer->m_loopNest) {
    writer->m_byteCodeInLoopCount = writer->m_byteCodeInLoopCount + 1;
  }
  return uVar1;
}

Assistant:

uint ByteCodeWriter::Data::EncodeT(OpCode op, ByteCodeWriter* writer)
    {
#ifdef BYTECODE_BRANCH_ISLAND
        if (writer->useBranchIsland)
        {
            writer->EnsureLongBranch(op);
        }
#endif

        Assert(op < Js::OpCode::ByteCodeLast);
        Assert(!OpCodeAttr::BackEndOnly(op));
        Assert(layoutSize == SmallLayout || OpCodeAttr::HasMultiSizeLayout(op));
        // Capture offset before encoding the opcode
        uint offset = GetCurrentOffset();
        EncodeOpCode<layoutSize>((uint16)op, writer);

        if (op != Js::OpCode::Ld_A)
        {
            writer->m_byteCodeWithoutLDACount++;
        }
        writer->IncreaseByteCodeCount();
        return offset;
    }